

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O3

double duckdb::GetInternalCValue<double,duckdb::TryCast>(duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  double dVar2;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      dVar2 = TryCastCInternal<bool,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_TINYINT:
      dVar2 = TryCastCInternal<signed_char,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_SMALLINT:
      dVar2 = TryCastCInternal<short,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_INTEGER:
      dVar2 = TryCastCInternal<int,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_BIGINT:
      dVar2 = TryCastCInternal<long,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_UTINYINT:
      dVar2 = TryCastCInternal<unsigned_char,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_USMALLINT:
      dVar2 = TryCastCInternal<unsigned_short,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_UINTEGER:
      dVar2 = TryCastCInternal<unsigned_int,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_UBIGINT:
      dVar2 = TryCastCInternal<unsigned_long,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_FLOAT:
      dVar2 = TryCastCInternal<float,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_DOUBLE:
      dVar2 = TryCastCInternal<double,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_TIMESTAMP:
      dVar2 = TryCastCInternal<duckdb::timestamp_t,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_DATE:
      dVar2 = TryCastCInternal<duckdb::date_t,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_TIME:
      dVar2 = TryCastCInternal<duckdb::dtime_t,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_INTERVAL:
      dVar2 = TryCastCInternal<duckdb::interval_t,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_HUGEINT:
      dVar2 = TryCastCInternal<duckdb::hugeint_t,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_VARCHAR:
      dVar2 = TryCastCInternal<char*,double,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return dVar2;
    case DUCKDB_TYPE_DECIMAL:
      dVar2 = TryCastDecimalCInternal<double>(result,col,row);
      return dVar2;
    case DUCKDB_TYPE_UHUGEINT:
      dVar2 = TryCastCInternal<duckdb::uhugeint_t,double,duckdb::TryCast>(result,col,row);
      return dVar2;
    }
  }
  return 0.0;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}